

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetObjectsNode::Evaluate
          (string *__return_storage_ptr__,TargetObjectsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  cmValue *this_00;
  bool bVar1;
  byte bVar2;
  TargetType TVar3;
  const_reference name;
  cmGeneratorTarget *this_01;
  ostream *poVar4;
  string *this_02;
  cmMakefile *this_03;
  string_view arg;
  string_view local_738;
  string_view local_728;
  reference local_718;
  string *o_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmMakefile *mf;
  cmAlphaNum local_6c0;
  string local_690;
  string *local_670;
  string *o;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_630 [8];
  string obj_dir;
  undefined1 local_600 [8];
  string suffix;
  cmValue imp;
  cmValue loc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string local_5b0;
  string local_590;
  undefined1 local_570 [8];
  ostringstream e_2;
  undefined1 local_3f8 [8];
  string reason;
  cmGlobalGenerator *gg;
  string local_3b0;
  ostringstream local_390 [8];
  ostringstream e_1;
  undefined1 local_210 [4];
  TargetType type;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream e;
  cmGeneratorTarget *gt;
  string *tgtName;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetObjectsNode *this_local;
  
  name = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::front(parameters);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,name);
  if (this_01 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar4 = std::operator<<((ostream *)local_1c0,"Objects of target \"");
    poVar4 = std::operator<<(poVar4,(string *)name);
    std::operator<<(poVar4,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1f0,content);
    std::__cxx11::ostringstream::str();
    reportError(context,&local_1f0,(string *)local_210);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  else {
    TVar3 = cmGeneratorTarget::GetType(this_01);
    if ((((TVar3 == EXECUTABLE) || (TVar3 == STATIC_LIBRARY)) || (TVar3 == SHARED_LIBRARY)) ||
       ((TVar3 == MODULE_LIBRARY || (TVar3 == OBJECT_LIBRARY)))) {
      reason.field_2._8_8_ = cmLocalGenerator::GetGlobalGenerator(context->LG);
      std::__cxx11::string::string((string *)local_3f8);
      if (((context->EvaluateForBuildsystem & 1U) != 0) ||
         (bVar1 = cmTarget::HasKnownObjectFileLocation(this_01->Target,(string *)local_3f8), bVar1))
      {
        bVar1 = false;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
        poVar4 = std::operator<<((ostream *)local_570,
                                 "The evaluation of the TARGET_OBJECTS generator expression is only suitable for consumption by CMake (limited"
                                );
        poVar4 = std::operator<<(poVar4,(string *)local_3f8);
        std::operator<<(poVar4,").  It is not suitable for writing out elsewhere.");
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_590,content);
        std::__cxx11::ostringstream::str();
        reportError(context,&local_590,&local_5b0);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        bVar1 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
      }
      std::__cxx11::string::~string((string *)local_3f8);
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&loc);
        bVar1 = cmGeneratorTarget::IsImported(this_01);
        if (bVar1) {
          cmValue::cmValue(&imp,(nullptr_t)0x0);
          this_00 = (cmValue *)((long)&suffix.field_2 + 8);
          cmValue::cmValue(this_00,(nullptr_t)0x0);
          std::__cxx11::string::string((string *)local_600);
          bVar1 = cmTarget::GetMappedConfig
                            (this_01->Target,&context->Config,&imp,this_00,(string *)local_600);
          if (bVar1) {
            this_02 = cmValue::operator*[abi_cxx11_(&imp);
            arg = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_02);
            obj_dir.field_2._8_8_ = arg._M_len;
            cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&loc,false);
          }
          context->HadContextSensitiveCondition = true;
          std::__cxx11::string::~string((string *)local_600);
        }
        else {
          cmGeneratorTarget::GetTargetObjectNames
                    (this_01,&context->Config,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&loc);
          std::__cxx11::string::string((string *)local_630);
          if (((context->EvaluateForBuildsystem & 1U) == 0) ||
             (bVar2 = (**(code **)(*(long *)reason.field_2._8_8_ + 0x1a8))(), (bVar2 & 1) != 0)) {
            cmGeneratorTarget::GetObjectDirectory((string *)&__range2,this_01,&context->Config);
            std::__cxx11::string::operator=((string *)local_630,(string *)&__range2);
            std::__cxx11::string::~string((string *)&__range2);
            context->HadContextSensitiveCondition = true;
          }
          else {
            std::__cxx11::string::operator=((string *)local_630,(string *)&this_01->ObjectDirectory)
            ;
            bVar1 = cmGeneratorTarget::HasContextDependentSources(this_01);
            context->HadContextSensitiveCondition = bVar1;
          }
          __end2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&loc);
          o = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&loc);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&o), bVar1) {
            local_670 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end2);
            cmAlphaNum::cmAlphaNum(&local_6c0,(string *)local_630);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&mf,local_670);
            cmStrCat<>(&local_690,&local_6c0,(cmAlphaNum *)&mf);
            std::__cxx11::string::operator=((string *)local_670,(string *)&local_690);
            std::__cxx11::string::~string((string *)&local_690);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end2);
          }
          std::__cxx11::string::~string((string *)local_630);
        }
        this_03 = cmLocalGenerator::GetMakefile(context->LG);
        __end1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&loc);
        o_1 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&loc);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&o_1), bVar1) {
          local_718 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end1);
          cmMakefile::AddTargetObject(this_03,name,local_718);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end1);
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_728,";");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_738);
        cmJoin(__return_storage_ptr__,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&loc,local_728,local_738);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&loc);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_390);
      poVar4 = std::operator<<((ostream *)local_390,"Objects of target \"");
      poVar4 = std::operator<<(poVar4,(string *)name);
      poVar4 = std::operator<<(poVar4,"\" referenced but is not one of the allowed target types ");
      std::operator<<(poVar4,"(EXECUTABLE, STATIC, SHARED, MODULE, OBJECT).");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3b0,content);
      std::__cxx11::ostringstream::str();
      reportError(context,&local_3b0,(string *)&gg);
      std::__cxx11::string::~string((string *)&gg);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::ostringstream::~ostringstream(local_390);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string const& tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::STATIC_LIBRARY &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY &&
        type != cmStateEnums::OBJECT_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not one of the allowed target types "
        << "(EXECUTABLE, STATIC, SHARED, MODULE, OBJECT).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    {
      std::string reason;
      if (!context->EvaluateForBuildsystem &&
          !gt->Target->HasKnownObjectFileLocation(&reason)) {
        std::ostringstream e;
        e << "The evaluation of the TARGET_OBJECTS generator expression "
             "is only suitable for consumption by CMake (limited"
          << reason
          << ").  "
             "It is not suitable for writing out elsewhere.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
    }

    std::vector<std::string> objects;

    if (gt->IsImported()) {
      cmValue loc = nullptr;
      cmValue imp = nullptr;
      std::string suffix;
      if (gt->Target->GetMappedConfig(context->Config, loc, imp, suffix)) {
        cmExpandList(*loc, objects);
      }
      context->HadContextSensitiveCondition = true;
    } else {
      gt->GetTargetObjectNames(context->Config, objects);

      std::string obj_dir;
      if (context->EvaluateForBuildsystem && !gg->SupportsCrossConfigs()) {
        // Use object file directory with buildsystem placeholder.
        obj_dir = gt->ObjectDirectory;
        context->HadContextSensitiveCondition =
          gt->HasContextDependentSources();
      } else {
        // Use object file directory with per-config location.
        obj_dir = gt->GetObjectDirectory(context->Config);
        context->HadContextSensitiveCondition = true;
      }

      for (std::string& o : objects) {
        o = cmStrCat(obj_dir, o);
      }
    }

    // Create the cmSourceFile instances in the referencing directory.
    cmMakefile* mf = context->LG->GetMakefile();
    for (std::string const& o : objects) {
      mf->AddTargetObject(tgtName, o);
    }

    return cmJoin(objects, ";");
  }